

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjTable::gc_trace_globals(CVmObjTable *this)

{
  long lVar1;
  vm_val_t *pvVar2;
  long in_RDI;
  vm_obj_id_t *objp;
  size_t i;
  vm_globalvar_t *var;
  vm_val_t *val;
  CVmObjGlobPage *pg;
  undefined8 in_stack_ffffffffffffffd8;
  CVmObjTable *in_stack_ffffffffffffffe0;
  CVmObjTable *this_00;
  undefined8 *local_10;
  
  for (local_10 = *(undefined8 **)(in_RDI + 8); local_10 != (undefined8 *)0x0;
      local_10 = (undefined8 *)*local_10) {
    for (lVar1 = local_10[1]; lVar1 != 0; lVar1 = lVar1 + -1) {
      add_to_gc_queue(in_stack_ffffffffffffffe0,(vm_obj_id_t)((ulong)lVar1 >> 0x20),(uint)lVar1);
    }
    in_stack_ffffffffffffffd8 = 0;
  }
  pvVar2 = CVmRun::get_r0();
  if ((pvVar2->typ == VM_OBJ) && ((pvVar2->val).obj != 0)) {
    add_to_gc_queue(in_stack_ffffffffffffffe0,
                    (vm_obj_id_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                    (uint)in_stack_ffffffffffffffd8);
  }
  for (this_00 = *(CVmObjTable **)(in_RDI + 0x10); this_00 != (CVmObjTable *)0x0;
      this_00 = (CVmObjTable *)this_00->global_var_head_) {
    if ((*(int *)&this_00->post_load_init_table_ == 5) && (*(int *)&this_00->globals_ != 0)) {
      add_to_gc_queue(this_00,(vm_obj_id_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                      (uint)in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void CVmObjTable::gc_trace_globals(VMG0_)
{
    CVmObjGlobPage *pg;
    vm_val_t *val;
    vm_globalvar_t *var;

    /* trace each page of globals */
    for (pg = globals_ ; pg != 0 ; pg = pg->nxt_)
    {
        size_t i;
        vm_obj_id_t *objp;

        /* trace each item on this page */
        for (objp = pg->objs_, i = pg->used_ ; i != 0 ; ++objp, --i)
        {
            /* trace this global */
            add_to_gc_queue(*objp, VMOBJ_REACHABLE);
        }
    }

    /* the return value register (R0) is a machine global */
    val = G_interpreter->get_r0();
    if (val->typ == VM_OBJ && val->val.obj != VM_INVALID_OBJ)
        add_to_gc_queue(val->val.obj, VMOBJ_REACHABLE);

    /* trace the global variables defined by other subsystems */
    for (var = global_var_head_ ; var != 0 ; var = var->nxt)
    {
        /* if this global variable contains an object, trace it */
        if (var->val.typ == VM_OBJ && var->val.val.obj != VM_INVALID_OBJ)
            add_to_gc_queue(var->val.val.obj, VMOBJ_REACHABLE);
    }
}